

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

CESkyCoord * __thiscall
CESkyCoord::ConvertToGalactic
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord(__return_storage_ptr__);
  switch(this->coord_type_) {
  case CIRS:
    CIRS2Galactic(this,__return_storage_ptr__,date);
    break;
  case ICRS:
    ICRS2Galactic(this,__return_storage_ptr__);
    break;
  case GALACTIC:
    SetCoordinates(__return_storage_ptr__,this);
    break;
  case OBSERVED:
    Observed2Galactic(this,__return_storage_ptr__,date,observer);
    break;
  case ECLIPTIC:
    Ecliptic2Galactic(this,__return_storage_ptr__,date);
  }
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToGalactic(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordiantes
    CESkyCoord galactic;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> GALACTIC
        CIRS2Galactic(*this, &galactic, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> GALACTIC
        ICRS2Galactic(*this, &galactic);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> GALACTIC
        galactic.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> GALACTIC
        Observed2Galactic(*this, &galactic, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> GALACTIC
        Ecliptic2Galactic(*this, &galactic, date);
    }
    
    return galactic;
}